

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::ReserveDestination::GetReservedDestination
          (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           *__return_storage_ptr__,ReserveDestination *this,bool internal)

{
  ScriptPubKeyMan *pSVar1;
  _Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *__rhs;
  bilingual_str *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  int64_t index;
  CKeyPool keypool;
  int64_t local_110;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_108;
  CKeyPool local_b8;
  bilingual_str local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = CWallet::GetScriptPubKeyMan(this->pwallet,&this->type,internal);
  this->m_spk_man = pSVar1;
  if (pSVar1 == (ScriptPubKeyMan *)0x0) {
    _((bilingual_str *)&local_b8,(ConstevalStringLiteral)0xe1c048);
    fmt = (bilingual_str *)FormatOutputType_abi_cxx11_(this->type);
    tinyformat::format<std::__cxx11::string>(&local_68,(tinyformat *)&local_b8,fmt,in_RCX);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                *)__return_storage_ptr__,&local_68);
    bilingual_str::~bilingual_str(&local_68);
    bilingual_str::~bilingual_str((bilingual_str *)&local_b8);
  }
  else {
    if (this->nIndex == -1) {
      CKeyPool::CKeyPool(&local_b8);
      (*this->m_spk_man->_vptr_ScriptPubKeyMan[6])
                (__return_storage_ptr__,this->m_spk_man,(ulong)this->type,(ulong)internal,&local_110
                 ,&local_b8);
      if ((__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          .
          super__Move_assign_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          .
          super__Copy_assign_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          .
          super__Move_ctor_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          .
          super__Copy_ctor_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          .
          super__Variant_storage_alias<bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
          ._M_index != '\x01') goto LAB_009a8837;
      this->nIndex = local_110;
      __rhs = (_Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)util::
                 Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                 ::value(__return_storage_ptr__);
      std::__detail::__variant::
      _Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::operator=((_Copy_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)&this->address,__rhs);
      this->fInternal = local_b8.fInternal;
      std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
      ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                           *)__return_storage_ptr__);
    }
    std::__detail::__variant::
    _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_108,
                      (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&this->address);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
    ::
    _Variant_storage<1ul,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
              ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                *)__return_storage_ptr__,&local_108);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage(&local_108);
  }
LAB_009a8837:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> ReserveDestination::GetReservedDestination(bool internal)
{
    m_spk_man = pwallet->GetScriptPubKeyMan(type, internal);
    if (!m_spk_man) {
        return util::Error{strprintf(_("Error: No %s addresses available."), FormatOutputType(type))};
    }

    if (nIndex == -1) {
        CKeyPool keypool;
        int64_t index;
        auto op_address = m_spk_man->GetReservedDestination(type, internal, index, keypool);
        if (!op_address) return op_address;
        nIndex = index;
        address = *op_address;
        fInternal = keypool.fInternal;
    }
    return address;
}